

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall graphics101::Mesh::computeNormals(Mesh *this,MeshNormalStrategy strategy)

{
  size_type __new_size;
  value_type local_20;
  MeshNormalStrategy local_14;
  Mesh *pMStack_10;
  MeshNormalStrategy strategy_local;
  Mesh *this_local;
  
  local_14 = strategy;
  pMStack_10 = this;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::clear(&this->normals);
  __new_size = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::size(&this->positions);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_20,0,0,0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(&this->normals,__new_size,&local_20);
  std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>::operator=
            (&this->face_normals,&this->face_positions);
  return;
}

Assistant:

void Mesh::computeNormals( MeshNormalStrategy strategy ) {
    
    // Clear any existing normals.
    normals.clear();
    // Make space for a normal for each position. Initialize them to 0.
    normals.resize( positions.size(), vec3(0,0,0) );
    // Since there is a normal for each position, face_normals should be identical
    // to face_positions.
    face_normals = face_positions;
    
    // Your code goes here.
    
    // Iterate over faces.
    
    // Normalize all normals.
    
}